

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O3

int __thiscall deci::ast_if_t::Generate(ast_if_t *this,ostream *output,int pc)

{
  pointer ppaVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ostream *poVar5;
  undefined4 in_register_00000014;
  pointer ppaVar6;
  int else_loc;
  
  uVar2 = (*this->condition->_vptr_ast_item_t[2])
                    (this->condition,output,CONCAT44(in_register_00000014,pc));
  std::__ostream_insert<char,std::char_traits<char>>(output,"jz __label_",0xb);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  uVar3 = uVar2 + 1;
  ppaVar1 = (this->true_path->statements).
            super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppaVar6 = (this->true_path->statements).
                 super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl
                 .super__Vector_impl_data._M_start; ppaVar6 != ppaVar1; ppaVar6 = ppaVar6 + 1) {
    uVar3 = (*(*ppaVar6)->_vptr_ast_item_t[2])(*ppaVar6,output,(ulong)uVar3);
  }
  uVar4 = uVar3;
  if (this->else_path != (ast_t *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(output,"jmp __label_",0xc);
    poVar5 = (ostream *)std::ostream::operator<<(output,uVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(output,": __label_",10);
    poVar5 = (ostream *)std::ostream::operator<<(output,uVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    uVar4 = uVar3 + 1;
    ppaVar1 = (this->else_path->statements).
              super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppaVar6 = (this->else_path->statements).
                   super__Vector_base<deci::ast_item_t_*,_std::allocator<deci::ast_item_t_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; uVar2 = uVar3, ppaVar6 != ppaVar1;
        ppaVar6 = ppaVar6 + 1) {
      uVar4 = (*(*ppaVar6)->_vptr_ast_item_t[2])(*ppaVar6,output,(ulong)uVar4);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(output,": __label_",10);
  poVar5 = (ostream *)std::ostream::operator<<(output,uVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"__",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  return uVar4;
}

Assistant:

int ast_if_t::Generate(std::ostream& output, int pc) const {
    pc = this->condition->Generate(output, pc);

    int true_loc = pc;

    output << "jz __label_" << true_loc << "__" << std::endl;
    pc = this->true_path->Generate(output, pc + 1);

    if (this->else_path != nullptr)
    {
      int else_loc = pc;
      output << "jmp __label_" << else_loc << "__" << std::endl;
      output << ": __label_" << true_loc << "__" << std::endl;
      pc = this->else_path->Generate(output, pc + 1);
      output << ": __label_" << else_loc << "__" << std::endl;
    }
    else
    {
      output << ": __label_" << true_loc << "__" << std::endl;
    }
    return pc;
  }